

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O3

bool __thiscall restincurl::Signaler::WasSignalled(Signaler *this)

{
  ssize_t sVar1;
  ssize_t sVar2;
  char byte;
  undefined1 local_29;
  
  local_29 = 0;
  sVar1 = read((this->pipefd_)._M_elems[0],&local_29,1);
  if (0 < sVar1) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::clog,"Signal: Was signalled",0x15);
      std::ios::widen((char)*(undefined8 *)(std::clog + -0x18));
      std::ostream::put('\0');
      std::ostream::flush();
      sVar2 = read((this->pipefd_)._M_elems[0],&local_29,1);
    } while (0 < sVar2);
  }
  return 0 < sVar1;
}

Assistant:

bool WasSignalled() {
            bool rval = false;
            char byte = {};
            while(read(pipefd_[FD_READ], &byte, 1) > 0) {
                RESTINCURL_LOG_TRACE("Signal: Was signalled");
                rval = true;
            }

            return rval;
        }